

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

UpnpListIter UpnpListInsert(UpnpListHead *list,UpnpListIter pos,UpnpListHead *elt)

{
  UpnpListHead *pUVar1;
  
  pUVar1 = pos->prev;
  elt->prev = pUVar1;
  elt->next = pos;
  pUVar1->next = elt;
  pos->prev = elt;
  return elt;
}

Assistant:

UpnpListIter UpnpListInsert(
	UpnpListHead *list, UpnpListIter pos, UpnpListHead *elt)
{
	(void)list;
	elt->prev = pos->prev;
	elt->next = pos;
	pos->prev->next = elt;
	pos->prev = elt;
	return elt;
}